

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::cons::test(cons *this)

{
  allocator<char> local_889;
  string local_888;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  cons *local_10;
  cons *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"(pair? (cons 1 2))",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x758,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"(pair? 12)",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x759,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"(pair? #t)",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x75a,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"(pair? #f)",&local_139);
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x75b,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"(pair? ())",&local_181);
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x75c,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(fixnum? (cons 12 43))",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x75e,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"(boolean? (cons 12 43))",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x75f,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"(null? (cons 12 43))",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x760,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"(not (cons 12 43))",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x761,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"(if (cons 12 43) 32 43)",&local_2e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_2e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("32",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x763,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(car(cons 1 23))",&local_331);
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_330,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x764,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"(cdr(cons 43 123))",&local_379);
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_378,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("123",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x765,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"(let([x(cons 1 2)] [y(cons 3 4)]) (pair? x))",&local_3c1);
  compile_fixture::run(&local_3a0,&this->super_compile_fixture,&local_3c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x766,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"(pair? (cons(cons 12 3) #f))",&local_409);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_408,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x767,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"(pair? (cons(cons 12 3) (cons #t #f)))",&local_451);
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_450,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x768,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"(car(car(cons(cons 12 3) (cons #t #f))))",&local_499);
  compile_fixture::run(&local_478,&this->super_compile_fixture,&local_498,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x769,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"(cdr(car(cons(cons 12 3) (cons #t #f))))",&local_4e1);
  compile_fixture::run(&local_4c0,&this->super_compile_fixture,&local_4e0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_4c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x76a,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"(car(cdr(cons(cons 12 3) (cons #t #f))))",&local_529);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_528,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x76b,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"(cdr(cdr(cons(cons 12 3) (cons #t #f))))",&local_571);
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_570,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x76c,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"(pair? (cons(* 1 1) 1))",&local_5b9);
  compile_fixture::run(&local_598,&this->super_compile_fixture,&local_5b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x76d,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,
             "(let ([t0 (cons 1 2)] [t1 (cons 3 4)]) (let([a0(car t0)][a1(car t1)][d0(cdr t0)][d1(cdr t1)])(let([t0(cons a0 d1)][t1(cons a1 d0)]) (cons t0 t1))))"
             ,&local_601);
  compile_fixture::run(&local_5e0,&this->super_compile_fixture,&local_600,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("((1 . 4) 3 . 2)",&local_5e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x76f,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"(let ([t (cons 1 2)])(let([t t])(let([t t])(let([t t]) t))))",
             &local_649);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_648,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(1 . 2)",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x770,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,
             "(let ([t (let ([t (let ([t (let ([t (cons 1 2)]) t)]) t)]) t)]) t)",&local_691);
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_690,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(1 . 2)",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x771,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,
             "(let ([x ()])(let([x(cons x x)])(let([x(cons x x)])(let([x(cons x x)])(cons x x)))))",
             &local_6d9);
  compile_fixture::run(&local_6b8,&this->super_compile_fixture,&local_6d8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("((((()) ()) (()) ()) ((()) ()) (()) ())",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x772,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,
             "(cons (let ([x #t]) (let ([y (cons x x)]) (cons x y))) (cons(let([x #f]) (let([y(cons x x)]) (cons y x))) ())) "
             ,&local_721);
  compile_fixture::run(&local_700,&this->super_compile_fixture,&local_720,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("((#t #t . #t) ((#f . #f) . #f))",&local_700,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x773,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,
             "(letrec ([f (lambda (i lst) (if (= i 0) lst (f (sub1 i) (cons i lst))))])(f 10 ())) ",
             &local_769);
  compile_fixture::run(&local_748,&this->super_compile_fixture,&local_768,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(1 2 3 4 5 6 7 8 9 10)",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x775,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b0,"(cons 2)",&local_7b1);
  compile_fixture::run(&local_790,&this->super_compile_fixture,&local_7b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("runtime error: cons: contract violation",&local_790,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x777,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"(cons 2 3 4)",&local_7f9)
  ;
  compile_fixture::run(&local_7d8,&this->super_compile_fixture,&local_7f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("runtime error: cons: contract violation",&local_7d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x778,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"(car 2)",&local_841);
  compile_fixture::run(&local_820,&this->super_compile_fixture,&local_840,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("runtime error: car: contract violation",&local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x77a,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"(cdr 2 3 4)",&local_889);
  compile_fixture::run(&local_868,&this->super_compile_fixture,&local_888,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("runtime error: cdr: contract violation",&local_868,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x77b,"void skiwi::(anonymous namespace)::cons::test()");
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#t", run("(pair? (cons 1 2))"));
      TEST_EQ("#f", run("(pair? 12)"));
      TEST_EQ("#f", run("(pair? #t)"));
      TEST_EQ("#f", run("(pair? #f)"));
      TEST_EQ("#f", run("(pair? ())"));

      TEST_EQ("#f", run("(fixnum? (cons 12 43))"));
      TEST_EQ("#f", run("(boolean? (cons 12 43))"));
      TEST_EQ("#f", run("(null? (cons 12 43))"));
      TEST_EQ("#f", run("(not (cons 12 43))"));

      TEST_EQ("32", run("(if (cons 12 43) 32 43)"));
      TEST_EQ("1", run("(car(cons 1 23))"));
      TEST_EQ("123", run("(cdr(cons 43 123))"));
      TEST_EQ("#t", run("(let([x(cons 1 2)] [y(cons 3 4)]) (pair? x))"));
      TEST_EQ("#t", run("(pair? (cons(cons 12 3) #f))"));
      TEST_EQ("#t", run("(pair? (cons(cons 12 3) (cons #t #f)))"));
      TEST_EQ("12", run("(car(car(cons(cons 12 3) (cons #t #f))))"));
      TEST_EQ("3", run("(cdr(car(cons(cons 12 3) (cons #t #f))))"));
      TEST_EQ("#t", run("(car(cdr(cons(cons 12 3) (cons #t #f))))"));
      TEST_EQ("#f", run("(cdr(cdr(cons(cons 12 3) (cons #t #f))))"));
      TEST_EQ("#t", run("(pair? (cons(* 1 1) 1))"));

      TEST_EQ("((1 . 4) 3 . 2)", run("(let ([t0 (cons 1 2)] [t1 (cons 3 4)]) (let([a0(car t0)][a1(car t1)][d0(cdr t0)][d1(cdr t1)])(let([t0(cons a0 d1)][t1(cons a1 d0)]) (cons t0 t1))))"));
      TEST_EQ("(1 . 2)", run("(let ([t (cons 1 2)])(let([t t])(let([t t])(let([t t]) t))))"));
      TEST_EQ("(1 . 2)", run("(let ([t (let ([t (let ([t (let ([t (cons 1 2)]) t)]) t)]) t)]) t)"));
      TEST_EQ("((((()) ()) (()) ()) ((()) ()) (()) ())", run("(let ([x ()])(let([x(cons x x)])(let([x(cons x x)])(let([x(cons x x)])(cons x x)))))"));
      TEST_EQ("((#t #t . #t) ((#f . #f) . #f))", run("(cons (let ([x #t]) (let ([y (cons x x)]) (cons x y))) (cons(let([x #f]) (let([y(cons x x)]) (cons y x))) ())) "));

      TEST_EQ("(1 2 3 4 5 6 7 8 9 10)", run("(letrec ([f (lambda (i lst) (if (= i 0) lst (f (sub1 i) (cons i lst))))])(f 10 ())) "));

      TEST_EQ("runtime error: cons: contract violation", run("(cons 2)"));
      TEST_EQ("runtime error: cons: contract violation", run("(cons 2 3 4)"));

      TEST_EQ("runtime error: car: contract violation", run("(car 2)"));
      TEST_EQ("runtime error: cdr: contract violation", run("(cdr 2 3 4)"));
      }